

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O2

UBool __thiscall icu_63::OlsonTimeZone::useDaylightTime(OlsonTimeZone *this)

{
  short transIdx;
  int iVar1;
  int32_t iVar2;
  int64_t iVar3;
  short transIdx_00;
  UDate time;
  double dVar4;
  double dVar5;
  double dVar6;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  
  time = uprv_getUTCtime_63();
  if ((this->finalZone != (SimpleTimeZone *)0x0) && (this->finalStartMillis <= time)) {
    iVar1 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9])
                      ();
    return (UBool)iVar1;
  }
  Grego::timeToFields(time,&year,&month,&dom,&dow,&doy,&mid);
  dVar4 = Grego::fieldsToDay(year,0,1);
  dVar5 = Grego::fieldsToDay(year + 1,0,1);
  transIdx_00 = -1;
  while( true ) {
    transIdx = transIdx_00 + 1;
    if ((short)(this->transitionCount32 + this->transitionCountPre32 + this->transitionCountPost32)
        <= transIdx) {
      return '\0';
    }
    iVar3 = transitionTimeInSeconds(this,transIdx);
    dVar6 = (double)iVar3;
    if (dVar5 * 86400.0 <= dVar6) break;
    if (((dVar4 * 86400.0 <= dVar6) && (iVar2 = dstOffsetAt(this,transIdx), iVar2 != 0)) ||
       ((dVar4 * 86400.0 < dVar6 && (iVar2 = dstOffsetAt(this,transIdx_00), iVar2 != 0)))) {
      return '\x01';
    }
    transIdx_00 = transIdx_00 + 1;
  }
  return '\0';
}

Assistant:

UBool OlsonTimeZone::useDaylightTime() const {
    // If DST was observed in 1942 (for example) but has never been
    // observed from 1943 to the present, most clients will expect
    // this method to return FALSE.  This method determines whether
    // DST is in use in the current year (at any point in the year)
    // and returns TRUE if so.

    UDate current = uprv_getUTCtime();
    if (finalZone != NULL && current >= finalStartMillis) {
        return finalZone->useDaylightTime();
    }

    int32_t year, month, dom, dow, doy, mid;
    Grego::timeToFields(current, year, month, dom, dow, doy, mid);

    // Find start of this year, and start of next year
    double start = Grego::fieldsToDay(year, 0, 1) * SECONDS_PER_DAY;
    double limit = Grego::fieldsToDay(year+1, 0, 1) * SECONDS_PER_DAY;

    // Return TRUE if DST is observed at any time during the current
    // year.
    for (int16_t i = 0; i < transitionCount(); ++i) {
        double transition = (double)transitionTimeInSeconds(i);
        if (transition >= limit) {
            break;
        }
        if ((transition >= start && dstOffsetAt(i) != 0)
                || (transition > start && dstOffsetAt(i - 1) != 0)) {
            return TRUE;
        }
    }
    return FALSE;
}